

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

void __thiscall setup::data_entry::load(data_entry *this,istream *is,info *i)

{
  flags<setup::info::entry_types_Enum_,_21UL> o;
  tm tm;
  uint16_t uVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  enum_type eVar5;
  unsigned_long uVar6;
  time tVar7;
  long lVar8;
  TypesafeBoolean p_Var9;
  int_adapter<unsigned_int> *in_RDX;
  char *in_RSI;
  uint *in_RDI;
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> flagreader;
  uint32_t file_version_ls;
  uint32_t file_version_ms;
  int64_t filetime;
  tm t;
  uint16_t date;
  uint16_t time;
  istream *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  enum_type in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  enum_type in_stack_fffffffffffffb6c;
  flags<setup::data_entry::flags_Enum_,_12UL> *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb90;
  undefined8 local_3b0;
  logger *in_stack_fffffffffffffc90;
  stored_enum<setup::(anonymous_namespace)::stored_sign_mode> *in_stack_fffffffffffffd08;
  istream *local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  flags<setup::data_entry::flags_Enum_,_12UL> *pfStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  int local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  int local_1d0;
  int local_1cc;
  unsigned_short local_1a8;
  unsigned_short local_1a6;
  int_adapter<unsigned_int> *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  setup::version::bits((version *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  uVar3 = util::load<unsigned_int>
                    ((istream *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                     (size_t)in_stack_fffffffffffffb58);
  *in_RDI = uVar3;
  setup::version::bits((version *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  uVar3 = util::load<unsigned_int>
                    ((istream *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                     (size_t)in_stack_fffffffffffffb58);
  in_RDI[1] = uVar3;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4000000) {
    if ((*in_RDI == 0) || (in_RDI[1] == 0)) {
      logger::logger((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                     (log_level)((ulong)in_stack_fffffffffffffb58 >> 0x20));
      logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (char (*) [10])in_stack_fffffffffffffb58);
      logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (uint *)in_stack_fffffffffffffb58);
      logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (char (*) [10])in_stack_fffffffffffffb58);
      logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (uint *)in_stack_fffffffffffffb58);
      logger::~logger(in_stack_fffffffffffffc90);
    }
    else {
      *in_RDI = *in_RDI - 1;
      in_RDI[1] = in_RDI[1] - 1;
    }
  }
  uVar3 = util::load<unsigned_int>((istream *)0x16ccb5);
  in_RDI[3] = uVar3;
  in_RDI[2] = uVar3;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4000100) {
    in_RDI[8] = 0;
    in_RDI[9] = 0;
  }
  else {
    uVar6 = util::load<unsigned_long>((istream *)0x16cce6);
    *(unsigned_long *)(in_RDI + 8) = uVar6;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4000000) {
    uVar3 = util::load<unsigned_int>((istream *)0x16cd62);
    *(ulong *)(in_RDI + 10) = (ulong)uVar3;
    uVar3 = util::load<unsigned_int>((istream *)0x16cd7f);
    *(ulong *)(in_RDI + 4) = (ulong)uVar3;
  }
  else {
    uVar6 = util::load<unsigned_long>((istream *)0x16cd28);
    *(unsigned_long *)(in_RDI + 10) = uVar6;
    uVar6 = util::load<unsigned_long>((istream *)0x16cd44);
    *(unsigned_long *)(in_RDI + 4) = uVar6;
  }
  *(undefined8 *)(in_RDI + 0x16) = *(undefined8 *)(in_RDI + 10);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x6040000) {
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
    if (uVar3 < 0x5030900) {
      uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
      if (uVar3 < 0x4020000) {
        uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
        if (uVar3 < 0x4000100) {
          uVar3 = util::load<unsigned_int>((istream *)0x16cebe);
          in_RDI[0xc] = uVar3;
          in_RDI[0x14] = 1;
        }
        else {
          uVar3 = util::load<unsigned_int>((istream *)0x16ce9b);
          in_RDI[0xc] = uVar3;
          in_RDI[0x14] = 2;
        }
      }
      else {
        std::istream::read(local_10,(long)(in_RDI + 0xc));
        in_RDI[0x14] = 3;
      }
    }
    else {
      std::istream::read(local_10,(long)(in_RDI + 0xc));
      in_RDI[0x14] = 4;
    }
  }
  else {
    std::istream::read(local_10,(long)(in_RDI + 0xc));
    in_RDI[0x14] = 5;
  }
  uVar1 = setup::version::bits
                    ((version *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  if (uVar1 == 0x10) {
    local_1a6 = util::load<unsigned_short>((istream *)0x16cefe);
    local_1a8 = util::load<unsigned_short>((istream *)0x16cf13);
    memset(&local_1e0,0,0x38);
    uVar2 = util::get_bits<unsigned_short>(local_1a6,0,4);
    local_1e0 = (uint)uVar2 << 1;
    uVar2 = util::get_bits<unsigned_short>(local_1a6,5,10);
    local_1dc = (uint)uVar2;
    uVar2 = util::get_bits<unsigned_short>(local_1a6,0xb,0xf);
    local_1d8 = (uint)uVar2;
    uVar2 = util::get_bits<unsigned_short>(local_1a8,0,4);
    local_1d4 = (uint)uVar2;
    uVar2 = util::get_bits<unsigned_short>(local_1a8,5,8);
    local_1d0 = uVar2 - 1;
    uVar2 = util::get_bits<unsigned_short>(local_1a8,9,0xf);
    local_1cc = uVar2 + 0x50;
    memcpy(&local_218,&local_1e0,0x38);
    in_stack_fffffffffffffb68 = (undefined4)local_208;
    in_stack_fffffffffffffb6c = (enum_type)((ulong)local_208 >> 0x20);
    in_stack_fffffffffffffb60 = (undefined4)uStack_210;
    in_stack_fffffffffffffb64 = (enum_type)((ulong)uStack_210 >> 0x20);
    tm.tm_hour = in_stack_fffffffffffffb68;
    tm.tm_sec = (undefined4)uStack_210;
    tm.tm_min = uStack_210._4_4_;
    tm.tm_mday = in_stack_fffffffffffffb6c;
    tm._16_8_ = pfStack_200;
    tm.tm_wday = (undefined4)local_1f8;
    tm.tm_yday = local_1f8._4_4_;
    tm._32_8_ = uStack_1f0;
    tm.tm_gmtoff = local_1e8;
    tm.tm_zone = in_stack_fffffffffffffb90;
    tVar7 = util::parse_time(tm);
    *(time *)(in_RDI + 0x18) = tVar7;
    in_RDI[0x1a] = 0;
    in_stack_fffffffffffffb58 = local_218;
    in_stack_fffffffffffffb70 = pfStack_200;
  }
  else {
    lVar8 = util::load<long>((istream *)0x16d077);
    if (lVar8 < 0x19db1ded53e8000) {
      logger::logger((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                     (log_level)((ulong)in_stack_fffffffffffffb58 >> 0x20));
      logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (char (*) [10])in_stack_fffffffffffffb58);
      logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (long *)in_stack_fffffffffffffb58);
      logger::~logger(in_stack_fffffffffffffc90);
    }
    *(long *)(in_RDI + 0x18) = (lVar8 + -0x19db1ded53e8000) / 10000000;
    in_RDI[0x1a] = (int)((lVar8 + -0x19db1ded53e8000) % 10000000) * 100;
  }
  uVar3 = util::load<unsigned_int>((istream *)0x16d178);
  uVar4 = util::load<unsigned_int>((istream *)0x16d18c);
  *(ulong *)(in_RDI + 0x1c) = CONCAT44(uVar3,uVar4);
  flags<setup::info::entry_types_Enum_,_21UL>::flags
            ((flags<setup::info::entry_types_Enum_,_21UL> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             &in_stack_fffffffffffffb58->_vptr_basic_istream);
  *(undefined8 *)(in_RDI + 0x1e) = local_3b0;
  setup::version::bits((version *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_>::stored_flag_reader
            ((stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),in_stack_fffffffffffffb58
             ,0x16d20c);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x20010ff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), uVar3 < 0x4000100))
  {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x40009ff < uVar3) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x400ffff < uVar3) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x40107ff < uVar3) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x401ffff < uVar3) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x40201ff < uVar3) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4020500) {
    flags<setup::data_entry::flags_Enum_,_12UL>::operator|=
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
  }
  else {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x5010cff < uVar3) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x50506ff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), uVar3 < 0x6030000))
  {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (enum_type)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  }
  stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
            ((stored_flag_reader<setup::data_entry::flags_Enum_> *)in_stack_fffffffffffffb58);
  o._flags.super__Base_bitset<1UL>._M_w._4_4_ = in_stack_fffffffffffffb64;
  o._flags.super__Base_bitset<1UL>._M_w._0_4_ = in_stack_fffffffffffffb60;
  flags<setup::info::entry_types_Enum_,_21UL>::operator|=
            ((flags<setup::info::entry_types_Enum_,_21UL> *)in_stack_fffffffffffffb58,o);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x6030000) {
    flags<setup::data_entry::flags_Enum_,_12UL>::operator&
              ((flags<setup::data_entry::flags_Enum_,_12UL> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               in_stack_fffffffffffffb64);
    p_Var9 = ::flags::operator_cast_to_function_pointer
                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x16d479);
    if (p_Var9 == (TypesafeBoolean)0x0) {
      flags<setup::data_entry::flags_Enum_,_12UL>::operator&
                ((flags<setup::data_entry::flags_Enum_,_12UL> *)
                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 in_stack_fffffffffffffb64);
      p_Var9 = ::flags::operator_cast_to_function_pointer
                         ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x16d4be);
      if (p_Var9 == (TypesafeBoolean)0x0) {
        in_RDI[0x20] = 0;
      }
      else {
        in_RDI[0x20] = 1;
      }
    }
    else {
      in_RDI[0x20] = 2;
    }
  }
  else {
    stored_enum<setup::(anonymous_namespace)::stored_sign_mode>::stored_enum
              ((stored_enum<setup::(anonymous_namespace)::stored_sign_mode> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               in_stack_fffffffffffffb58);
    eVar5 = stored_enum<setup::(anonymous_namespace)::stored_sign_mode>::get
                      (in_stack_fffffffffffffd08);
    in_RDI[0x20] = eVar5;
  }
  flags<setup::data_entry::flags_Enum_,_12UL>::operator&
            ((flags<setup::data_entry::flags_Enum_,_12UL> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),in_stack_fffffffffffffb64
            );
  p_Var9 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x16d519);
  if (p_Var9 == (TypesafeBoolean)0x0) {
    in_RDI[6] = 0;
  }
  else {
    in_RDI[6] = local_18[0x198].value_;
  }
  flags<setup::data_entry::flags_Enum_,_12UL>::operator&
            ((flags<setup::data_entry::flags_Enum_,_12UL> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),in_stack_fffffffffffffb64
            );
  p_Var9 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x16d574);
  if (p_Var9 != (TypesafeBoolean)0x0) {
    flags<setup::data_entry::flags_Enum_,_12UL>::operator|=
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
    in_RDI[6] = 2;
  }
  flags<setup::data_entry::flags_Enum_,_12UL>::operator&
            ((flags<setup::data_entry::flags_Enum_,_12UL> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),in_stack_fffffffffffffb64
            );
  p_Var9 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x16d5ca);
  if (p_Var9 == (TypesafeBoolean)0x0) {
    in_RDI[7] = 0;
  }
  else {
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
    if (uVar3 < 0x6040000) {
      uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
      if (uVar3 < 0x5030900) {
        in_RDI[7] = 1;
      }
      else {
        in_RDI[7] = 2;
      }
    }
    else {
      in_RDI[7] = 3;
    }
  }
  flags<setup::data_entry::flags_Enum_,_12UL>::operator&
            ((flags<setup::data_entry::flags_Enum_,_12UL> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),in_stack_fffffffffffffb64
            );
  p_Var9 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x16d667);
  if (p_Var9 == (TypesafeBoolean)0x0) {
    in_RDI[0x15] = 0;
  }
  else {
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
    if (uVar3 < 0x5020000) {
      in_RDI[0x15] = 1;
    }
    else {
      uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
      if (uVar3 < 0x5030900) {
        in_RDI[0x15] = 2;
      }
      else {
        in_RDI[0x15] = 3;
      }
    }
  }
  return;
}

Assistant:

void data_entry::load(std::istream & is, const info & i) {
	
	chunk.first_slice = util::load<boost::uint32_t>(is, i.version.bits());
	chunk.last_slice = util::load<boost::uint32_t>(is, i.version.bits());
	if(i.version < INNO_VERSION(4, 0, 0)) {
		if(chunk.first_slice < 1 || chunk.last_slice < 1) {
			log_warning << "Unexpected slice number: " << chunk.first_slice
			            << " to " << chunk.last_slice;
		} else {
			chunk.first_slice--, chunk.last_slice--;
		}
	}
	
	chunk.sort_offset = chunk.offset = util::load<boost::uint32_t>(is);
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		file.offset = util::load<boost::uint64_t>(is);
	} else {
		file.offset = 0;
	}
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		file.size = util::load<boost::uint64_t>(is);
		chunk.size = util::load<boost::uint64_t>(is);
	} else {
		file.size = util::load<boost::uint32_t>(is);
		chunk.size = util::load<boost::uint32_t>(is);
	}
	uncompressed_size = file.size;
	
	if(i.version >= INNO_VERSION(6, 4, 0)) {
		is.read(file.checksum.sha256, std::streamsize(sizeof(file.checksum.sha256)));
		file.checksum.type = crypto::SHA256;
	} else if(i.version >= INNO_VERSION(5, 3, 9)) {
		is.read(file.checksum.sha1, std::streamsize(sizeof(file.checksum.sha1)));
		file.checksum.type = crypto::SHA1;
	} else if(i.version >= INNO_VERSION(4, 2, 0)) {
		is.read(file.checksum.md5, std::streamsize(sizeof(file.checksum.md5)));
		file.checksum.type = crypto::MD5;
	} else if(i.version >= INNO_VERSION(4, 0, 1)) {
		file.checksum.crc32 = util::load<boost::uint32_t>(is);
		file.checksum.type = crypto::CRC32;
	} else {
		file.checksum.adler32 = util::load<boost::uint32_t>(is);
		file.checksum.type = crypto::Adler32;
	}
	
	if(i.version.bits() == 16) {
		
		// 16-bit installers use the FAT filetime format
		
		boost::uint16_t time = util::load<boost::uint16_t>(is);
		boost::uint16_t date = util::load<boost::uint16_t>(is);
		
		struct tm t;
		std::memset(&t, 0, sizeof(t));
		t.tm_sec  = util::get_bits(time,  0,  4) * 2;           // [0, 58]
		t.tm_min  = util::get_bits(time,  5, 10);               // [0, 59]
		t.tm_hour = util::get_bits(time, 11, 15);               // [0, 23]
		t.tm_mday = util::get_bits(date,  0,  4);               // [1, 31]
		t.tm_mon  = util::get_bits(date,  5,  8) - 1;           // [0, 11]
		t.tm_year = util::get_bits(date,  9, 15) + 1980 - 1900; // [80, 199]
		
		timestamp = util::parse_time(t);
		timestamp_nsec = 0;
		
	} else {
		
		// 32-bit installers use the Win32 FILETIME format
		
		boost::int64_t filetime = util::load<boost::int64_t>(is);
		
		static const boost::int64_t FiletimeOffset = 0x19DB1DED53E8000ll;
		if(filetime < FiletimeOffset) {
			log_warning << "Unexpected filetime: " << filetime;
		}
		filetime -= FiletimeOffset;
		
		timestamp = filetime / 10000000;
		timestamp_nsec = boost::uint32_t(filetime % 10000000) * 100;
		
	}
	
	boost::uint32_t file_version_ms = util::load<boost::uint32_t>(is);
	boost::uint32_t file_version_ls = util::load<boost::uint32_t>(is);
	file_version = (boost::uint64_t(file_version_ms) << 32)
	             |  boost::uint64_t(file_version_ls);
	
	options = 0;
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	flagreader.add(VersionInfoValid);
	flagreader.add(VersionInfoNotValid);
	if(i.version >= INNO_VERSION(2, 0, 17) && i.version < INNO_VERSION(4, 0, 1)) {
		flagreader.add(BZipped);
	}
	if(i.version >= INNO_VERSION(4, 0, 10)) {
		flagreader.add(TimeStampInUTC);
	}
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		flagreader.add(IsUninstallerExe);
	}
	if(i.version >= INNO_VERSION(4, 1, 8)) {
		flagreader.add(CallInstructionOptimized);
	}
	if(i.version >= INNO_VERSION(4, 2, 0)) {
		flagreader.add(Touch);
	}
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		flagreader.add(ChunkEncrypted);
	}
	if(i.version >= INNO_VERSION(4, 2, 5)) {
		flagreader.add(ChunkCompressed);
	} else {
		options |= ChunkCompressed;
	}
	if(i.version >= INNO_VERSION(5, 1, 13)) {
		flagreader.add(SolidBreak);
	}
	if(i.version >= INNO_VERSION(5, 5, 7) && i.version < INNO_VERSION(6, 3, 0)) {
		// Actually added in Inno Setup 5.5.9 but the data version was not bumped
		flagreader.add(Sign);
		flagreader.add(SignOnce);
	}
	
	options |= flagreader.finalize();
	
	if(i.version >= INNO_VERSION(6, 3, 0)) {
		sign = stored_enum<stored_sign_mode>(is).get();
	} else if(options & SignOnce) {
		sign = Once;
	} else if(options & Sign) {
		sign = Yes;
	} else {
		sign = NoSetting;
	}
	
	if(options & ChunkCompressed) {
		chunk.compression = i.header.compression;
	} else {
		chunk.compression = stream::Stored;
	}
	if(options & BZipped) {
		options |= ChunkCompressed;
		chunk.compression = stream::BZip2;
	}
	
	if(options & ChunkEncrypted) {
		if(i.version >= INNO_VERSION(6, 4, 0)) {
			chunk.encryption = stream::XChaCha20;
		} else if(i.version >= INNO_VERSION(5, 3, 9)) {
			chunk.encryption = stream::ARC4_SHA1;
		} else {
			chunk.encryption = stream::ARC4_MD5;
		}
	} else {
		chunk.encryption = stream::Plaintext;
	}
	
	if(options & CallInstructionOptimized) {
		if(i.version < INNO_VERSION(5, 2, 0)) {
			file.filter = stream::InstructionFilter4108;
		} else if(i.version < INNO_VERSION(5, 3, 9)) {
			file.filter = stream::InstructionFilter5200;
		} else {
			file.filter = stream::InstructionFilter5309;
		}
	} else {
		file.filter = stream::NoFilter;
	}
}